

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O1

void ngram_fwdtree_init(ngram_search_t *ngs)

{
  bestbp_rc_t *pbVar1;
  lastphn_cand_t *plVar2;
  
  pbVar1 = (bestbp_rc_t *)
           __ckd_calloc__((long)((ngs->base).acmod)->mdef->n_ciphone,0xc,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x180);
  ngs->bestbp_rc = pbVar1;
  plVar2 = (lastphn_cand_t *)
           __ckd_calloc__((long)(ngs->base).n_words,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x182);
  ngs->lastphn_cand = plVar2;
  init_search_tree(ngs);
  create_search_channels(ngs);
  return;
}

Assistant:

void
ngram_fwdtree_init(ngram_search_t *ngs)
{
    /* Allocate bestbp_rc, lastphn_cand, last_ltrans */
    ngs->bestbp_rc = ckd_calloc(bin_mdef_n_ciphone(ps_search_acmod(ngs)->mdef),
                                sizeof(*ngs->bestbp_rc));
    ngs->lastphn_cand = ckd_calloc(ps_search_n_words(ngs),
                                   sizeof(*ngs->lastphn_cand));
    init_search_tree(ngs);
    create_search_channels(ngs);
}